

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToUniMB::map2
          (CCharmapToUniMB *this,char **output_ptr,size_t *output_buf_len,char *input_ptr,
          size_t input_len,size_t *partial_len)

{
  wchar_t ch;
  bool bVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  *partial_len = 0;
  sVar4 = 0;
  do {
    if (input_len == 0) {
      return sVar4;
    }
    pwVar2 = this->map_[(byte)*input_ptr].sub;
    if (pwVar2 == (wchar_t *)0x0) {
      pwVar2 = &this->map_[(byte)*input_ptr].ch;
      lVar7 = -1;
      lVar6 = 1;
LAB_001f379a:
      ch = *pwVar2;
      uVar3 = (ulong)(ch < L'ࠀ') ^ 3;
      if (ch < L'\x80') {
        uVar3 = 1;
      }
      if (*output_buf_len < uVar3) {
        sVar5 = 0;
      }
      else {
        uVar3 = utf8_ptr::s_putch(*output_ptr,ch);
        *output_ptr = *output_ptr + uVar3;
        sVar5 = *output_buf_len - uVar3;
      }
      input_ptr = (char *)((byte *)input_ptr + lVar6);
      input_len = input_len + lVar7;
      *output_buf_len = sVar5;
      sVar4 = sVar4 + uVar3;
      bVar1 = true;
    }
    else {
      if (input_len != 1) {
        pwVar2 = pwVar2 + ((byte *)input_ptr)[1];
        lVar7 = -2;
        lVar6 = 2;
        goto LAB_001f379a;
      }
      *partial_len = 1;
      input_len = 1;
      bVar1 = false;
    }
    if (!bVar1) {
      return sVar4;
    }
  } while( true );
}

Assistant:

size_t CCharmapToUniMB::map2(char **output_ptr, size_t *output_buf_len,
                             const char *input_ptr, size_t input_len,
                             size_t *partial_len) const
{
    size_t needed_out_len;

    /* presume we won't have a partial last character */
    *partial_len = 0;

    /* we haven't found anything to store in the output yet */
    needed_out_len = 0;

    /* keep going until we've mapped each character */
    while (input_len != 0)
    {
        unsigned char c;
        const cmap_mb_entry *entp;
        wchar_t wc;
        size_t wlen;

        /* get the lead byte of the next input character */
        c = *input_ptr;

        /* get the primary mapping table entry for the lead byte */
        entp = &map_[c];

        /* check for a one-byte or two-byte mapping */
        if (entp->sub == 0)
        {
            /* it's a one-byte character - get the mapping */
            wc = entp->ch;

            /* skip the single byte of input */
            ++input_ptr;
            --input_len;
        }
        else
        {
            /* 
             *   it's a two-byte character lead byte - make sure we have a
             *   complete input character 
             */
            if (input_len < 2)
            {
                /* we have an incomplete last character - tell the caller */
                *partial_len = 1;

                /* we're done mapping it */
                break;
            }

            /* get the second byte of the sequence */
            c = input_ptr[1];

            /* get the translation from the sub-table */
            wc = entp->sub[c];

            /* skip the two-byte sequence */
            input_ptr += 2;
            input_len -= 2;
        }

        /* we have the translation - note its stored UTF-8 byte size */
        wlen = utf8_ptr::s_wchar_size(wc);

        /* check for room to store the output character */
        if (wlen > *output_buf_len)
        {
            /* 
             *   there's no room to store this character - zero out the
             *   output buffer length so that we know not to try storing
             *   anything else in the buffer 
             */
            *output_buf_len = 0;
        }
        else
        {
            /* there's room - store it */
            wlen = utf8_ptr::s_putch(*output_ptr, wc);

            /* consume output buffer space */
            *output_ptr += wlen;
            *output_buf_len -= wlen;
        }

        /* count the needed length, whether we stored it or not */
        needed_out_len += wlen;
    }

    /* return the required output length */
    return needed_out_len;
}